

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O0

void __thiscall
mp::internal::MemoryMappedFileBase::map(MemoryMappedFileBase *this,int fd,size_t size)

{
  CStringRef message;
  undefined8 uVar1;
  size_t in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  char *start;
  int in_stack_ffffffffffffffd4;
  BasicCStringRef<char> in_stack_ffffffffffffffd8;
  
  message.data_ = (char *)mmap((void *)0x0,in_RDX,1,2,in_ESI,0);
  if (message.data_ == (char *)0xffffffffffffffff) {
    uVar1 = __cxa_allocate_exception(0x18);
    __errno_location();
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffd8,"cannot map file");
    fmt::SystemError::SystemError
              ((SystemError *)in_stack_ffffffffffffffd8.data_,in_stack_ffffffffffffffd4,message);
    __cxa_throw(uVar1,&fmt::SystemError::typeinfo,fmt::SystemError::~SystemError);
  }
  *in_RDI = message.data_;
  in_RDI[1] = in_RDX;
  return;
}

Assistant:

void mp::internal::MemoryMappedFileBase::map(int fd, std::size_t size) {
  char *start = reinterpret_cast<char*>(
      mmap(0, size, PROT_READ, MAP_PRIVATE, fd, 0));
  if (start == MAP_FAILED)
    throw SystemError(errno, "cannot map file");
  start_ = start;
  size_ = size;
}